

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O1

void inner_loop<true,false>
               (cs_active *cs_a,single_learner *base,example *ec,uint32_t i,float cost,
               uint32_t *prediction,float *score,float *partial_prediction,bool query_this_label,
               bool *query_needed)

{
  int iVar1;
  uint64_t *puVar2;
  float fVar3;
  float fVar4;
  ostream *poVar5;
  
  iVar1 = i - 1;
  puVar2 = &(ec->super_example_predict).ft_offset;
  *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar1);
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  puVar2 = &(ec->super_example_predict).ft_offset;
  *puVar2 = *puVar2 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar1);
  (ec->l).simple.weight = 1.0;
  ec->weight = 1.0;
  if (*query_needed == true) {
    (ec->l).simple.label = cost;
    if ((cost < cs_a->cost_min) || (cs_a->cost_max <= cost && cost != cs_a->cost_max)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"warning: cost ",0xe)
      ;
      poVar5 = std::ostream::_M_insert<double>((double)cost);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," outside of cost range [",0x18);
      poVar5 = std::ostream::_M_insert<double>((double)cs_a->cost_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::ostream::_M_insert<double>((double)cs_a->cost_max);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]!",2);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  else {
    (ec->l).multi.label = 0x7f7fffff;
  }
  fVar3 = (ec->l).simple.label;
  if ((fVar3 != 3.4028235e+38) || (NAN(fVar3))) {
    puVar2 = &(ec->super_example_predict).ft_offset;
    *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar1);
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    puVar2 = &(ec->super_example_predict).ft_offset;
    *puVar2 = *puVar2 - (ulong)(uint)(iVar1 * *(int *)(base + 0xe0));
  }
  *partial_prediction = ec->partial_prediction;
  fVar3 = ec->partial_prediction;
  fVar4 = *score;
  if ((fVar3 < fVar4) || (((fVar3 == fVar4 && (!NAN(fVar3) && !NAN(fVar4))) && (i < *prediction))))
  {
    *score = fVar3;
    *prediction = i;
  }
  if (ec->passthrough != (features *)0x0) {
    features::push_back(ec->passthrough,ec->partial_prediction,(ulong)i ^ 0x398d9fda640553);
    return;
  }
  return;
}

Assistant:

inline void inner_loop(cs_active& cs_a, single_learner& base, example& ec, uint32_t i, float cost, uint32_t& prediction,
    float& score, float& partial_prediction, bool query_this_label, bool& query_needed)
{
  base.predict(ec, i - 1);
  // cerr << "base.predict ==> partial_prediction=" << ec.partial_prediction << endl;
  if (is_learn)
  {
    vw& all = *cs_a.all;
    ec.l.simple.weight = 1.;
    ec.weight = 1.;
    if (is_simulation)
    {
      // In simulation mode
      if (query_this_label)
      {
        ec.l.simple.label = cost;
        all.sd->queries += 1;
      }
      else
        ec.l.simple.label = FLT_MAX;
    }
    else
    {
      // In reduction mode.
      // If the cost of this label was previously queried, then it should be available for learning now.
      // If the cost of this label was not queried, then skip it.
      if (query_needed)
      {
        ec.l.simple.label = cost;
        if ((cost < cs_a.cost_min) || (cost > cs_a.cost_max))
          cerr << "warning: cost " << cost << " outside of cost range [" << cs_a.cost_min << ", " << cs_a.cost_max
               << "]!" << endl;
      }
      else
        ec.l.simple.label = FLT_MAX;
    }

    if (ec.l.simple.label != FLT_MAX)
      base.learn(ec, i - 1);
  }
  else if (!is_simulation)
    // Prediction in reduction mode could be used by upper layer to ask whether this label needs to be queried.
    // So we return that.
    query_needed = query_this_label;

  partial_prediction = ec.partial_prediction;
  if (ec.partial_prediction < score || (ec.partial_prediction == score && i < prediction))
  {
    score = ec.partial_prediction;
    prediction = i;
  }
  add_passthrough_feature(ec, i, ec.partial_prediction);
}